

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2centroids.cc
# Opt level: O1

S2Point * S2::TrueCentroid(S2Point *__return_storage_ptr__,S2Point *a,S2Point *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar5 = a->c_[0] + b->c_[0];
  dVar6 = a->c_[1] + b->c_[1];
  dVar7 = a->c_[2] + b->c_[2];
  dVar4 = dVar7 * dVar7 + dVar6 * dVar6 + dVar5 * dVar5;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    dVar3 = a->c_[0] - b->c_[0];
    dVar2 = a->c_[1] - b->c_[1];
    dVar1 = a->c_[2] - b->c_[2];
    dVar4 = (dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3) / dVar4;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    __return_storage_ptr__->c_[0] = dVar5 * dVar4;
    __return_storage_ptr__->c_[1] = dVar6 * dVar4;
    __return_storage_ptr__->c_[2] = dVar7 * dVar4;
  }
  else {
    __return_storage_ptr__->c_[0] = 0.0;
    __return_storage_ptr__->c_[1] = 0.0;
    __return_storage_ptr__->c_[2] = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

S2Point TrueCentroid(const S2Point& a, const S2Point& b) {
  // The centroid (multiplied by length) is a vector toward the midpoint
  // of the edge, whose length is twice the sine of half the angle between
  // the two vertices.  Defining theta to be this angle, we have:
  S2Point vdiff = a - b;  // Length == 2*sin(theta)
  S2Point vsum = a + b;   // Length == 2*cos(theta)
  double sin2 = vdiff.Norm2();
  double cos2 = vsum.Norm2();
  if (cos2 == 0) return S2Point();  // Ignore antipodal edges.
  return sqrt(sin2 / cos2) * vsum;  // Length == 2*sin(theta)
}